

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

Ivy_Man_t * Ivy_ManStartFrom(Ivy_Man_t *p)

{
  Ivy_Man_t *p_00;
  void *pvVar1;
  Ivy_Obj_t *pIVar2;
  int i;
  
  p_00 = Ivy_ManStart();
  p->pConst1->pEquiv = p_00->pConst1;
  for (i = 0; i < p->vPis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vPis,i);
    pIVar2 = Ivy_ObjCreatePi(p_00);
    *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar2;
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManStartFrom( Ivy_Man_t * p )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    return pNew;
}